

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O2

bool bssl::ssl_tls13_cipher_meets_policy(uint16_t cipher_id,ssl_compliance_policy_t policy)

{
  ushort uVar1;
  
  uVar1 = 1;
  switch(policy) {
  case ssl_compliance_policy_none:
  case ssl_compliance_policy_cnsa_202407:
    break;
  case ssl_compliance_policy_fips_202205:
    if (2 < (ushort)(cipher_id + 0xecff)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                    ,0x267,
                    "bool bssl::ssl_tls13_cipher_meets_policy(uint16_t, enum ssl_compliance_policy_t)"
                   );
    }
    uVar1 = (ushort)(3 >> ((byte)(cipher_id + 0xecff) & 7));
    break;
  case ssl_compliance_policy_wpa3_192_202304:
    uVar1 = cipher_id + 0xecff;
    if (2 < uVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                    ,0x273,
                    "bool bssl::ssl_tls13_cipher_meets_policy(uint16_t, enum ssl_compliance_policy_t)"
                   );
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                  ,0x278,
                  "bool bssl::ssl_tls13_cipher_meets_policy(uint16_t, enum ssl_compliance_policy_t)"
                 );
  }
  return (bool)((byte)uVar1 & 1);
}

Assistant:

bool ssl_tls13_cipher_meets_policy(uint16_t cipher_id,
                                   enum ssl_compliance_policy_t policy) {
  switch (policy) {
    case ssl_compliance_policy_none:
    case ssl_compliance_policy_cnsa_202407:
      return true;

    case ssl_compliance_policy_fips_202205:
      switch (cipher_id) {
        case TLS1_3_CK_AES_128_GCM_SHA256 & 0xffff:
        case TLS1_3_CK_AES_256_GCM_SHA384 & 0xffff:
          return true;
        case TLS1_3_CK_CHACHA20_POLY1305_SHA256 & 0xffff:
          return false;
        default:
          assert(false);
          return false;
      }

    case ssl_compliance_policy_wpa3_192_202304:
      switch (cipher_id) {
        case TLS1_3_CK_AES_256_GCM_SHA384 & 0xffff:
          return true;
        case TLS1_3_CK_AES_128_GCM_SHA256 & 0xffff:
        case TLS1_3_CK_CHACHA20_POLY1305_SHA256 & 0xffff:
          return false;
        default:
          assert(false);
          return false;
      }
  }

  assert(false);
  return false;
}